

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM_Command.h
# Opt level: O0

shared_ptr<nigel::IM_Constant> __thiscall
nigel::IM_Operator::as<nigel::IM_Constant>(IM_Operator *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<nigel::IM_Constant> sVar1;
  enable_shared_from_this<nigel::IM_Operator> local_28;
  IM_Operator *this_local;
  
  this_local = this;
  std::enable_shared_from_this<nigel::IM_Operator>::shared_from_this(&local_28);
  std::static_pointer_cast<nigel::IM_Constant,nigel::IM_Operator>
            ((shared_ptr<nigel::IM_Operator> *)this);
  std::shared_ptr<nigel::IM_Operator>::~shared_ptr((shared_ptr<nigel::IM_Operator> *)&local_28);
  sVar1.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<nigel::IM_Constant>)
         sVar1.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> as()
		{
			return std::static_pointer_cast< T >( shared_from_this() );
		}